

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::PrintTopLevelExtensions(Generator *this)

{
  long lVar1;
  Printer *pPVar2;
  long lVar3;
  long local_80;
  string local_70 [32];
  string constant_name;
  
  local_80 = 0;
  for (lVar3 = 0; lVar3 < *(int *)(this->file_ + 0x78); lVar3 = lVar3 + 1) {
    lVar1 = *(long *)(this->file_ + 0x80);
    std::operator+(&constant_name,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (lVar1 + local_80),"_FIELD_NUMBER");
    UpperString(&constant_name);
    pPVar2 = this->printer_;
    google::protobuf::SimpleItoa_abi_cxx11_((int)local_70);
    google::protobuf::io::Printer::Print
              ((char *)pPVar2,"$constant_name$ = $number$\n",(string *)"constant_name",
               (char *)&constant_name,(string *)"number");
    std::__cxx11::string::~string(local_70);
    google::protobuf::io::Printer::Print((char *)this->printer_,"$name$ = ",(string *)0x16bff5);
    PrintFieldDescriptor(this,(FieldDescriptor *)(lVar1 + local_80),true);
    google::protobuf::io::Printer::Print((char *)this->printer_);
    std::__cxx11::string::~string((string *)&constant_name);
    local_80 = local_80 + 0x78;
  }
  google::protobuf::io::Printer::Print((char *)this->printer_);
  return;
}

Assistant:

void Generator::PrintTopLevelExtensions() const {
  const bool is_extension = true;
  for (int i = 0; i < file_->extension_count(); ++i) {
    const FieldDescriptor& extension_field = *file_->extension(i);
    string constant_name = extension_field.name() + "_FIELD_NUMBER";
    UpperString(&constant_name);
    printer_->Print("$constant_name$ = $number$\n",
      "constant_name", constant_name,
      "number", SimpleItoa(extension_field.number()));
    printer_->Print("$name$ = ", "name", extension_field.name());
    PrintFieldDescriptor(extension_field, is_extension);
    printer_->Print("\n");
  }
  printer_->Print("\n");
}